

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall asl::Log::storeState(Log *this)

{
  bool bVar1;
  bool bVar2;
  String value;
  String local_48;
  String local_30;
  
  local_48.field_2._space[0] = '\0';
  local_48._size = 0;
  local_48._len = 0;
  bVar1 = this->_useconsole;
  bVar2 = this->_usefile;
  String::operator+=(&local_48,(char)this->_maxLevel + '0');
  String::operator+=(&local_48,bVar2 | bVar1 * '\x02' | 0x30);
  String::operator+=(&local_48,&this->_logfile);
  String::String(&local_30,"ASL_LOG");
  Process::setEnv(&local_30,&local_48);
  String::~String(&local_30);
  String::~String(&local_48);
  return;
}

Assistant:

void Log::storeState()
{
#ifndef __ANDROID_API__
	String value;
	int flags = (_usefile ? 1 : 0) | (_useconsole ? 2 : 0);
	value << char(_maxLevel + '0') << char(flags + '0') << _logfile;
	Process::setEnv("ASL_LOG", value);
#endif
}